

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O0

int TestRegEncoding(CodeGenGenericContext *ctx,uchar *stream,x86Command op,
                   _func_int_uchar_ptr_x86Reg *fun)

{
  int iVar1;
  uint local_34;
  uint reg;
  uchar *start;
  _func_int_uchar_ptr_x86Reg *fun_local;
  uchar *puStack_18;
  x86Command op_local;
  uchar *stream_local;
  CodeGenGenericContext *ctx_local;
  
  puStack_18 = stream;
  for (local_34 = 0; local_34 < 9; local_34 = local_34 + 1) {
    EMIT_OP_REG(ctx,op,testRegs[local_34]);
    iVar1 = (*fun)(puStack_18,testRegs[local_34]);
    puStack_18 = puStack_18 + iVar1;
  }
  return (int)puStack_18 - (int)stream;
}

Assistant:

int TestRegEncoding(CodeGenGenericContext &ctx, unsigned char *stream, x86Command op, int (*fun)(unsigned char *stream, x86Reg reg))
{
	unsigned char *start = stream;

	for(unsigned reg = 0; reg < sizeof(testRegs) / sizeof(testRegs[0]); reg++)
	{
		EMIT_OP_REG(ctx, op, testRegs[reg]);
		stream += fun(stream, testRegs[reg]);
	}

	return int(stream - start);
}